

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_convert_tile_tbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  void *__ptr;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if ((((zbitpix != 8) || (scale != 1.0)) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    iVar3 = 0x19d;
  }
  else {
    uVar6 = (ulong)(uint)outfptr->Fptr->compress_type;
    if ((uVar6 < 0x34) && ((0x8000000600800U >> (uVar6 & 0x3f) & 1) != 0)) {
      *intlength = 1;
      if ((nullcheck == 1) && (bVar1 = *nullflagval, (uint)bVar1 != nullval)) {
        for (; 0 < tilelen; tilelen = tilelen + -1) {
          if (*(byte *)((long)tiledata + tilelen + -1) == bVar1) {
            *(char *)((long)tiledata + tilelen + -1) = (char)nullval;
          }
        }
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        bVar1 = *nullflagval;
        for (; 0 < tilelen; tilelen = tilelen + -1) {
          bVar2 = *(byte *)((long)tiledata + tilelen + -1);
          uVar4 = (uint)bVar2;
          if (bVar2 == bVar1) {
            uVar4 = nullval;
          }
          *(uint *)((long)tiledata + tilelen * 4 + -4) = uVar4;
        }
      }
      else if (*status < 1) {
        lVar7 = 10000;
        if (tilelen < 10000) {
          lVar7 = tilelen;
        }
        __ptr = malloc(lVar7 * 4);
        if (__ptr == (void *)0x0) {
          ffpmsg("Out of memory. (fits_ubyte_to_int_inplace)");
          *status = 0x71;
        }
        else {
          lVar5 = tilelen - lVar7;
          while (lVar8 = lVar5, 0 < lVar7) {
            for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
              *(uint *)((long)__ptr + lVar5 * 4) = (uint)*(byte *)((long)tiledata + lVar5 + lVar8);
            }
            memcpy((void *)((long)tiledata + lVar8 * 4),__ptr,lVar7 * 4);
            lVar5 = lVar8 + -10000;
            if (lVar8 < 0x2711) {
              lVar5 = 0;
              lVar7 = lVar8;
            }
            if (lVar8 == 0) {
              lVar7 = lVar8;
            }
          }
          free(__ptr);
        }
      }
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int imcomp_convert_tile_tbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input unsigned integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    unsigned char *usbbuff;
        
       /* datatype of input array is unsigned byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = 1.  */

       if (zbitpix != BYTE_IMG || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       idata = (int *) tiledata;
       usbbuff = (unsigned char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2, or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       usbbuff[ii] = (unsigned char) nullval;
                    }
               }
           }
       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) usbbuff[ii];
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert usbbuff to an I*4 array, in place */
                 /* usbbuff must have been allocated large enough to do this */
                 fits_ubyte_to_int_inplace(usbbuff, tilelen, status);
           }
       }

       return(*status);
}